

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O2

void __thiscall
Bezier<3,_2>::Bezier
          (Bezier<3,_2> *this,initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *list)

{
  (this->super_Curve<3,_2>).length_ = -1.0;
  (this->super_Curve<3,_2>)._vptr_Curve = (_func_int **)&PTR_computeLength_0010d9f0;
  set(this,list);
  return;
}

Assistant:

Bezier(const std::initializer_list<PointType>& list) { set(std::forward<decltype(list)>(list)); }